

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

void __thiscall
icu_63::CollationRuleParser::parseRelationStrings
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char16_t *pcVar7;
  char16_t cVar8;
  UnicodeString prefix;
  UnicodeString str;
  UnicodeString extension;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar3 = parseTailoringString(this,i,&local_b0,errorCode);
  if (U_ZERO_ERROR < *errorCode) goto LAB_0023f92a;
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  if ((int)uVar3 < (int)uVar4) {
    cVar8 = L'\xffff';
    if (uVar3 < uVar4) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar7 = (pUVar2->fUnion).fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&pUVar2->fUnion + 2);
      }
      cVar8 = pcVar7[(int)uVar3];
    }
  }
  else {
    cVar8 = L'\0';
  }
  if (cVar8 == L'|') {
    UnicodeString::operator=(&local_f0,&local_b0);
    uVar3 = parseTailoringString(this,uVar3 + 1,&local_b0,errorCode);
    if (U_ZERO_ERROR < *errorCode) goto LAB_0023f92a;
    pUVar2 = this->rules;
    sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar4 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)sVar1 >> 5;
    }
    if ((int)uVar3 < (int)uVar4) {
      cVar8 = L'\xffff';
      if (uVar3 < uVar4) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar7 = (pUVar2->fUnion).fFields.fArray;
        }
        else {
          pcVar7 = (char16_t *)((long)&pUVar2->fUnion + 2);
        }
        cVar8 = pcVar7[(int)uVar3];
      }
    }
    else {
      cVar8 = L'\0';
    }
  }
  if (cVar8 == L'/') {
    uVar3 = parseTailoringString(this,uVar3 + 1,&local_70,errorCode);
  }
  if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_0023f8c6:
    (*(this->sink->super_UObject)._vptr_UObject[4])
              (this->sink,strength,&local_f0,&local_b0,&local_70,&this->errorReason,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      setErrorContext(this);
    }
    this->ruleIndex = uVar3;
  }
  else {
    uVar4 = UnicodeString::char32At(&local_f0,0);
    uVar5 = UnicodeString::char32At(&local_b0,0);
    iVar6 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar4);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar5);
      if ((char)iVar6 != '\0') goto LAB_0023f8c6;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      this->errorReason = "in \'prefix|str\', prefix and str must each start with an NFC boundary";
      if (this->parseError != (UParseError *)0x0) {
        setErrorContext(this);
      }
    }
  }
LAB_0023f92a:
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  return;
}

Assistant:

void
CollationRuleParser::parseRelationStrings(int32_t strength, int32_t i, UErrorCode &errorCode) {
    // Parse
    //     prefix | str / extension
    // where prefix and extension are optional.
    UnicodeString prefix, str, extension;
    i = parseTailoringString(i, str, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UChar next = (i < rules->length()) ? rules->charAt(i) : 0;
    if(next == 0x7c) {  // '|' separates the context prefix from the string.
        prefix = str;
        i = parseTailoringString(i + 1, str, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        next = (i < rules->length()) ? rules->charAt(i) : 0;
    }
    if(next == 0x2f) {  // '/' separates the string from the extension.
        i = parseTailoringString(i + 1, extension, errorCode);
    }
    if(!prefix.isEmpty()) {
        UChar32 prefix0 = prefix.char32At(0);
        UChar32 c = str.char32At(0);
        if(!nfc.hasBoundaryBefore(prefix0) || !nfc.hasBoundaryBefore(c)) {
            setParseError("in 'prefix|str', prefix and str must each start with an NFC boundary",
                          errorCode);
            return;
        }
    }
    sink->addRelation(strength, prefix, str, extension, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
}